

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

int __thiscall
section_data::pull_used_layers
          (section_data *this,vector<int,_std::allocator<int>_> *destination_vector)

{
  iterator this_00;
  bool bVar1;
  pointer ppVar2;
  uint local_2c;
  _Self local_28;
  _Self local_20;
  iterator it;
  vector<int,_std::allocator<int>_> *destination_vector_local;
  section_data *this_local;
  
  it._M_node = (_Base_ptr)destination_vector;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
       ::begin(&this->polygons);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
         ::end(&this->polygons);
    bVar1 = std::operator!=(&local_20,&local_28);
    this_00 = it;
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
             ::operator->(&local_20);
    local_2c = ppVar2->first;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)this_00._M_node,
               (value_type_conflict1 *)&local_2c);
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
    ::operator++(&local_20);
  }
  return 0;
}

Assistant:

int section_data::pull_used_layers(vector<int> &destination_vector)
{
  for (auto it = polygons.begin(); it != polygons.end(); ++it) {
    destination_vector.push_back(it->first);
  }
  return EXIT_SUCCESS;
}